

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11EglPlatform.cpp
# Opt level: O3

NativeWindow * __thiscall
tcu::x11::egl::WindowFactory::createWindow
          (WindowFactory *this,NativeDisplay *nativeDisplay,WindowParams *params)

{
  Display *display;
  Window *this_00;
  
  if (nativeDisplay == (NativeDisplay *)0x0) {
    display = (Display *)0x0;
  }
  else {
    display = (Display *)
              __dynamic_cast(nativeDisplay,&eglu::NativeDisplay::typeinfo,&Display::typeinfo);
  }
  this_00 = (Window *)operator_new(0x38);
  Window::Window(this_00,display,params,(Visual *)0x0);
  return &this_00->super_NativeWindow;
}

Assistant:

NativeWindow* WindowFactory::createWindow (NativeDisplay*		nativeDisplay,
										   const WindowParams&	params) const
{
	Display&	display	= *dynamic_cast<Display*>(nativeDisplay);

	return new Window(display, params, DE_NULL);
}